

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O2

bool __thiscall BinarySearchTree::removeElement(BinarySearchTree *this,int value)

{
  Node **ppNVar1;
  Node *parent;
  Node *location;
  
  if (this->root == (Node *)0x0) {
    return false;
  }
  find(this,value,&parent,&location);
  if (location == (Node *)0x0) {
    return false;
  }
  if (location->leftChild == (Node *)0x0) {
    if (location->rightChild == (Node *)0x0) {
      ppNVar1 = &this->root;
      if (parent != (Node *)0x0) {
        ppNVar1 = &parent->rightChild;
        if (parent->leftChild == location) {
          ppNVar1 = &parent->leftChild;
        }
      }
      *ppNVar1 = (Node *)0x0;
      if (location->leftChild != (Node *)0x0) goto LAB_001069b1;
    }
LAB_001069df:
    if ((location->rightChild == (Node *)0x0) ||
       (caseB(this,parent,location), location->leftChild == (Node *)0x0)) goto LAB_00106a14;
  }
  else {
LAB_001069b1:
    if ((location->rightChild == (Node *)0x0) &&
       (caseB(this,parent,location), location->leftChild == (Node *)0x0)) goto LAB_001069df;
  }
  if (location->rightChild != (Node *)0x0) {
    caseC(this,parent,location);
  }
LAB_00106a14:
  operator_delete(location,0x18);
  return true;
}

Assistant:

bool BinarySearchTree::removeElement(int value) {
    Node *parent, *location;
    if (root == nullptr) {
        return false;
    }
    find(value, &parent, &location);
    if (location == nullptr) {
        return false;
    }
    if (location->leftChild == nullptr && location->rightChild == nullptr) {
        caseA(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild == nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild == nullptr && location->rightChild != nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild != nullptr) {
        caseC(parent, location);
    }
    delete location;
    return true;
}